

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::FundSelectUtxoData::FundSelectUtxoData(FundSelectUtxoData *this)

{
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  FundSelectUtxoData *local_10;
  FundSelectUtxoData *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::FundSelectUtxoData>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::FundSelectUtxoData>);
  (this->super_JsonClassBase<cfd::js::api::json::FundSelectUtxoData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__FundSelectUtxoData_01b43f68;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->vout_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->address_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->amount_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->redeem_script_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->descriptor_,"",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  this->is_issuance_ = false;
  this->is_blind_issuance_ = false;
  this->is_pegin_ = false;
  this->pegin_btc_tx_size_ = 0;
  this->pegin_tx_out_proof_size_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->claim_script_,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->fedpeg_script_,"",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->script_sig_template_,"",&local_2b);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  CollectFieldName();
  return;
}

Assistant:

FundSelectUtxoData() {
    CollectFieldName();
  }